

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentQLearner.cpp
# Opt level: O0

double __thiscall
AgentQLearner::getMaxState
          (AgentQLearner *this,Index sI,list<unsigned_int,_std::allocator<unsigned_int>_> *actions)

{
  size_type sVar1;
  reference pdVar2;
  long in_RDX;
  int __x;
  list<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint j;
  row_t row;
  double dMax;
  size_type in_stack_ffffffffffffff78;
  matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffff80;
  QTable *in_stack_ffffffffffffff88;
  uint local_34;
  undefined1 local_30 [16];
  _List_node_base *local_20;
  long local_18;
  
  local_18 = in_RDX;
  if (in_RDX != 0) {
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::clear
              ((list<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff80);
  }
  local_20 = (_List_node_base *)0xffefffffffffffff;
  QTable::GetRow(in_stack_ffffffffffffff88,(Index)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  for (local_34 = 0;
      sVar1 = boost::numeric::ublas::
              matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
              ::size((matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                      *)0x8fd9b7), local_34 < sVar1; local_34 = local_34 + 1) {
    __x = (int)local_30;
    pdVar2 = boost::numeric::ublas::
             matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
             ::operator()(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    this_00 = (list<unsigned_int,_std::allocator<unsigned_int>_> *)(*pdVar2 - (double)local_20);
    std::abs(__x);
    if (1e-09 <= (double)this_00) {
      in_stack_ffffffffffffff88 =
           (QTable *)
           boost::numeric::ublas::
           matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
           ::operator()(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if ((double)local_20 <
          (double)(in_stack_ffffffffffffff88->super_QTableInterface)._vptr_QTableInterface) {
        in_stack_ffffffffffffff80 =
             (matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
              *)boost::numeric::ublas::
                matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                ::operator()(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        local_20 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                    &in_stack_ffffffffffffff80->data_)->_M_impl)._M_node.super__List_node_base.
                   _M_next;
        if (local_18 != 0) {
          std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::clear
                    ((list<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff80)
          ;
          std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (this_00,(value_type_conflict1 *)in_stack_ffffffffffffff88);
        }
      }
    }
    else if (local_18 != 0) {
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (this_00,(value_type_conflict1 *)in_stack_ffffffffffffff88);
    }
  }
  boost::numeric::ublas::
  matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  ::~matrix_row(in_stack_ffffffffffffff80);
  return (double)local_20;
}

Assistant:

double AgentQLearner::getMaxState(Index sI, list<Index>* actions) const
{
    if(actions)
        actions->clear();

    double dMax = -DBL_MAX;

    row_t row = _m_Q.GetRow(sI); // Q values for a specific state

    for(unsigned j = 0; j < row.size(); ++j)
    {
        if( std::abs( row(j) - dMax ) < EPSILON )
        {
            if(actions)
                actions->push_back(j);
        }
        else if( row(j) > dMax )
        {
            dMax = row(j);
            if(actions)
            {
                actions->clear();
                actions->push_back(j);
            }
        }
    }

    return dMax;
}